

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  size_type_conflict sVar3;
  allocator local_241;
  string local_240 [32];
  string local_220 [8];
  string user_min_length;
  allocator local_1f9;
  string local_1f8 [32];
  int local_1d8;
  allocator local_1d1;
  int min_length;
  string local_1b0 [8];
  string user_min_period;
  allocator local_189;
  string local_188 [32];
  int local_168;
  allocator local_161;
  int min_period;
  string local_140 [8];
  string user_max_report;
  allocator local_119;
  string local_118 [32];
  unsigned_long_long local_f8;
  size_t max_report;
  RepeatIterator local_e8;
  Repeat *local_e0;
  __normal_iterator<const_tandem::Repeat_*,_std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>
  local_d8;
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [32];
  string local_80 [32];
  undefined1 local_60 [8];
  vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> repeats;
  string local_38 [8];
  string sequence;
  char **argv_local;
  int argc_local;
  
  std::__cxx11::string::string(local_38);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_38);
  capitalise<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  bVar1 = is_dna<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  if ((!bVar1) &&
     (bVar1 = is_rna<std::__cxx11::string>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_38), !bVar1)) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"this example is only for DNA or RNA sequences");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  std::__cxx11::string::string(local_80,local_38);
  get_repeats((vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> *)local_60,(string *)local_80
              ,true);
  std::__cxx11::string::~string(local_80);
  poVar2 = std::operator<<((ostream *)&std::clog,"Found ");
  sVar3 = std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>::size
                    ((vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> *)local_60);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  poVar2 = std::operator<<(poVar2," tandem repeats!");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"-a",&local_a1);
  bVar1 = cmd_option_exists(argv,argv + argc,(string *)local_a0);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"-c",&local_c9);
    bVar1 = cmd_option_exists(argv,argv + argc,(string *)local_c8);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    if (bVar1) {
      local_d8._M_current =
           (Repeat *)
           std::cbegin<std::vector<tandem::Repeat,std::allocator<tandem::Repeat>>>
                     ((vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> *)local_60);
      local_e0 = (Repeat *)
                 std::cend<std::vector<tandem::Repeat,std::allocator<tandem::Repeat>>>
                           ((vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> *)local_60);
      print_csv_format<__gnu_cxx::__normal_iterator<tandem::Repeat_const*,std::vector<tandem::Repeat,std::allocator<tandem::Repeat>>>>
                (local_d8,(__normal_iterator<const_tandem::Repeat_*,_std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>
                           )local_e0,(string *)local_38);
    }
    else {
      local_e8._M_current =
           (Repeat *)
           std::begin<std::vector<tandem::Repeat,std::allocator<tandem::Repeat>>>
                     ((vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> *)local_60);
      max_report = (size_t)std::end<std::vector<tandem::Repeat,std::allocator<tandem::Repeat>>>
                                     ((vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> *)
                                      local_60);
      print(local_e8,(RepeatIterator)max_report,(string *)local_38);
    }
  }
  else {
    local_f8 = 10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_118,"-n",&local_119);
    bVar1 = cmd_option_exists(argv,argv + argc,(string *)local_118);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&min_period,"-n",&local_161);
      get_cmd_option((char **)local_140,argv,(string *)(argv + argc));
      std::__cxx11::string::~string((string *)&min_period);
      std::allocator<char>::~allocator((allocator<char> *)&local_161);
      local_f8 = std::__cxx11::stoull(local_140,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)local_140);
    }
    local_168 = -1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_188,"-p",&local_189);
    bVar1 = cmd_option_exists(argv,argv + argc,(string *)local_188);
    std::__cxx11::string::~string(local_188);
    std::allocator<char>::~allocator((allocator<char> *)&local_189);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&min_length,"-p",&local_1d1);
      get_cmd_option((char **)local_1b0,argv,(string *)(argv + argc));
      std::__cxx11::string::~string((string *)&min_length);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
      local_168 = std::__cxx11::stoi(local_1b0,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)local_1b0);
    }
    report_biggest_periods
              ((vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> *)local_60,
               (string *)local_38,local_f8,local_168);
    local_1d8 = -1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f8,"-l",&local_1f9);
    bVar1 = cmd_option_exists(argv,argv + argc,(string *)local_1f8);
    std::__cxx11::string::~string(local_1f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_240,"-l",&local_241);
      get_cmd_option((char **)local_220,argv,(string *)(argv + argc));
      std::__cxx11::string::~string(local_240);
      std::allocator<char>::~allocator((allocator<char> *)&local_241);
      local_1d8 = std::__cxx11::stoi(local_220,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)local_220);
    }
    report_biggest_lengths
              ((vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> *)local_60,
               (string *)local_38,local_f8,local_1d8);
  }
  std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>::~vector
            ((vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> *)local_60);
  std::__cxx11::string::~string(local_38);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    std::string sequence;
    std::getline(std::cin, sequence);
    capitalise(sequence);
    if (!is_dna(sequence) && !is_rna(sequence)) {
        std::cerr << "this example is only for DNA or RNA sequences" << std::endl;
        exit(0);
    }
    auto repeats = get_repeats(sequence);
    std::clog << "Found " << repeats.size() << " tandem repeats!" << std::endl;
    if (cmd_option_exists(argv, argv + argc, "-a")) {
        if (cmd_option_exists(argv, argv + argc, "-c")) {
            print_csv_format(std::cbegin(repeats), std::cend(repeats), sequence);
        } else {
            print(std::begin(repeats), std::end(repeats), sequence);
        }
    } else {
        std::size_t max_report {10};
        if (cmd_option_exists(argv, argv + argc, "-n")) {
            const std::string user_max_report {get_cmd_option(argv, argv + argc, "-n")};
            max_report = std::stoull(user_max_report);
        }
        int min_period {-1};
        if (cmd_option_exists(argv, argv + argc, "-p")) {
            const std::string user_min_period {get_cmd_option(argv, argv + argc, "-p")};
            min_period = std::stoi(user_min_period);
        }
        report_biggest_periods(repeats, sequence, max_report, min_period);
        int min_length {-1};
        if (cmd_option_exists(argv, argv + argc, "-l")) {
            const std::string user_min_length {get_cmd_option(argv, argv + argc, "-l")};
            min_length = std::stoi(user_min_length);
        }
        report_biggest_lengths(repeats, sequence, max_report, min_length);
    }
}